

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void boundaryPM(BPMLists *lists,BPMNode *leaves,size_t numpresent,int c,int num)

{
  BPMNode *pBVar1;
  uint index;
  BPMNode **ppBVar2;
  long lVar3;
  int weight;
  long lVar4;
  
  ppBVar2 = lists->chains1;
  lVar4 = (long)c;
  pBVar1 = ppBVar2[lVar4];
  index = pBVar1->index;
  if (c != 0) {
    lVar3 = 0;
    do {
      weight = ppBVar2[lVar4 + lVar3 + -1]->weight + lists->chains0[lVar4 + lVar3 + -1]->weight;
      lists->chains0[lVar4 + lVar3] = pBVar1;
      if ((index < numpresent) && (leaves[index].weight < weight)) {
        pBVar1 = bpmnode_create(lists,leaves[index].weight,index + 1,
                                lists->chains1[lVar4 + lVar3]->tail);
        lVar4 = lVar4 + lVar3;
        goto LAB_0012594e;
      }
      pBVar1 = bpmnode_create(lists,weight,index,lists->chains1[lVar4 + lVar3 + -1]);
      lists->chains1[lVar4 + lVar3] = pBVar1;
      if ((int)numpresent * 2 + -2 <= num + 1) {
        return;
      }
      boundaryPM(lists,leaves,numpresent,c + -1 + (int)lVar3,num);
      ppBVar2 = lists->chains1;
      pBVar1 = ppBVar2[lVar4 + lVar3 + -1];
      index = pBVar1->index;
      lVar3 = lVar3 + -1;
    } while (lVar4 + lVar3 != 0);
  }
  if (index < numpresent) {
    *lists->chains0 = pBVar1;
    lVar4 = 0;
    pBVar1 = bpmnode_create(lists,leaves[index].weight,index + 1,(BPMNode *)0x0);
LAB_0012594e:
    lists->chains1[lVar4] = pBVar1;
  }
  return;
}

Assistant:

static void boundaryPM(BPMLists* lists, BPMNode* leaves, size_t numpresent, int c, int num) {
  unsigned lastindex = lists->chains1[c]->index;

  if (c == 0) {
    if (lastindex >= numpresent) return;
    lists->chains0[c] = lists->chains1[c];
    lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, 0);
  }
  else {
    /*sum of the weights of the head nodes of the previous lookahead chains.*/
    int sum = lists->chains0[c - 1]->weight + lists->chains1[c - 1]->weight;
    lists->chains0[c] = lists->chains1[c];
    if (lastindex < numpresent && sum > leaves[lastindex].weight) {
      lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, lists->chains1[c]->tail);
      return;
    }
    lists->chains1[c] = bpmnode_create(lists, sum, lastindex, lists->chains1[c - 1]);
    /*in the end we are only interested in the chain of the last list, so no
    need to recurse if we're at the last one (this gives measurable speedup)*/
    if (num + 1 < (int)(2 * numpresent - 2)) {
      boundaryPM(lists, leaves, numpresent, c - 1, num);
      boundaryPM(lists, leaves, numpresent, c - 1, num);
    }
  }
}